

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O3

int process_events_stone(CManager_conflict cm,int s,action_class c)

{
  int *piVar1;
  action_value aVar2;
  event_path_data evp_00;
  FMFormat p_Var3;
  attr_list p_Var4;
  _proto_action *p_Var5;
  EVImmediateHandlerFunc p_Var6;
  bool bVar7;
  int iVar8;
  __pid_t _Var9;
  int iVar10;
  int iVar11;
  stone_type stone;
  stone_type p_Var12;
  response_cache_element *prVar13;
  event_item *peVar14;
  pthread_t pVar15;
  CManager_conflict p_Var16;
  queue_item *pqVar17;
  queue_item *pqVar18;
  FILE *pFVar19;
  event_item *act;
  undefined1 *puVar20;
  ev_handler_activation_ptr rec;
  size_t __size;
  CManager_conflict p_Var21;
  event_path_data evp_01;
  queue_item *pqVar22;
  char *pcVar23;
  char *in_R8;
  event_path_data evp;
  long lVar24;
  _event_path_data *p_Var25;
  timespec ts_2;
  timespec ts;
  event_item *local_b0;
  int local_a8;
  response_cache_element *local_a0;
  timespec local_70;
  FILE *local_60;
  _ev_handler_activation_rec local_58;
  int *local_38;
  
  if (s == -1) {
    return 0;
  }
  evp_00 = cm->evp;
  local_38 = (int *)evp_00->as;
  if (*local_38 == s) {
    *local_38 = -1;
  }
  stone = stone_struct(evp_00,s);
  if (stone == (stone_type)0x0) {
    return 0;
  }
  if (stone->queue_size == 0) {
    return 0;
  }
  pFVar19 = (FILE *)cm->CMTrace_file;
  if (pFVar19 == (FILE *)0x0) {
    iVar8 = CMtrace_init(cm,EVerbose);
    if (iVar8 != 0) {
      pFVar19 = (FILE *)cm->CMTrace_file;
      goto LAB_00133a9e;
    }
  }
  else if (CMtrace_val[10] != 0) {
LAB_00133a9e:
    fwrite("Considering events on ",0x16,1,pFVar19);
    fprint_stone_identifier(cm->CMTrace_file,evp_00,s);
    fputc(10,(FILE *)cm->CMTrace_file);
  }
  if (stone->local_id == -1) {
    return 0;
  }
  if (stone->is_draining == 2) {
    return 0;
  }
  if (stone->is_frozen == 1) {
    return 0;
  }
  local_a8 = 0;
  if ((c == Immediate_and_Multi) && (stone->pending_output != 0)) {
    local_a8 = process_stone_pending_output(cm,s);
  }
  p_Var12 = stone_struct(cm->evp,s);
  if ((((long)p_Var12->default_action != -1) && (c != Bridge)) &&
     (p_Var12->proto_actions[p_Var12->default_action].action_type == Action_Bridge)) {
    return 0;
  }
  pFVar19 = (FILE *)cm->CMTrace_file;
  if (pFVar19 == (FILE *)0x0) {
    iVar8 = CMtrace_init(cm,EVerbose);
    if (iVar8 == 0) goto LAB_00133bbb;
    pFVar19 = (FILE *)cm->CMTrace_file;
  }
  else if (CMtrace_val[10] == 0) goto LAB_00133bbb;
  fwrite("Process events ",0xf,1,pFVar19);
  fprint_stone_identifier(cm->CMTrace_file,evp_00,s);
  fputc(10,(FILE *)cm->CMTrace_file);
LAB_00133bbb:
  pqVar17 = stone->queue->queue_head;
  p_Var12 = stone_struct(cm->evp,s);
  if ((((long)p_Var12->default_action == -1) || (c != Bridge)) ||
     (p_Var12->proto_actions[p_Var12->default_action].action_type != Action_Bridge)) {
    if (pqVar17 != (queue_item *)0x0) {
      bVar7 = false;
      do {
        if ((stone->is_draining != 0) || (stone->is_frozen != 0)) break;
        pqVar22 = pqVar17->next;
        pqVar18 = pqVar22;
        if (pqVar17->handled == 0) {
          local_b0 = pqVar17->item;
          iVar8 = determine_action(cm,stone,c,local_b0,(int)in_R8);
          if (stone->response_cache_count <= iVar8) {
            __assert_fail("resp_id < stone->response_cache_count",
                          "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                          ,0x6d0,"int process_events_stone(CManager, int, action_class)");
          }
          prVar13 = stone->response_cache;
          if ((c == Immediate_and_Multi) && (prVar13[iVar8].action_type == Action_NoAction)) {
            if (local_b0->reference_format == (FMFormat)0x0) {
              local_a0 = (response_cache_element *)0x0;
            }
            else {
              local_a0 = (response_cache_element *)global_name_of_FMFormat();
            }
            printf("No action found for event %p submitted to \n",local_b0);
            fprint_stone_identifier(_stdout,evp_00,s);
            putchar(10);
            p_Var12 = stone_struct(evp_00,s);
            fdump_stone(_stdout,p_Var12);
            if (local_a0 == (response_cache_element *)0x0) {
              puts("    Unhandled incoming event format was NULL");
            }
            else {
              printf("    Unhandled incoming event format was \"%s\"\n");
              if (process_events_stone_first == '\0') {
                process_events_stone_first = '\x01';
                puts("\n\t** use \"format_info <format_name>\" to get full format information ** \n"
                    );
              }
              free(local_a0);
            }
            p_Var16 = cm;
            local_b0 = dequeue_item(cm,stone,pqVar17);
            return_event((event_path_data)p_Var16,local_b0);
            prVar13 = stone->response_cache;
          }
          local_a0 = prVar13 + iVar8;
          if (prVar13[iVar8].action_type == Action_Decode) {
            if (local_b0->event_encoded == 0) {
              iVar10 = CMtrace_val[10];
              if (cm->CMTrace_file == (FILE *)0x0) {
                iVar10 = CMtrace_init(cm,EVerbose);
              }
              if (iVar10 != 0) {
                if (CMtrace_PID != 0) {
                  local_60 = (FILE *)cm->CMTrace_file;
                  _Var9 = getpid();
                  pVar15 = pthread_self();
                  fprintf(local_60,"P%lxT%lx - ",(long)_Var9,pVar15);
                }
                if (CMtrace_timing != 0) {
                  clock_gettime(1,(timespec *)&local_58);
                  fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_58.prev,local_58.thread_id)
                  ;
                }
                fprintf((FILE *)cm->CMTrace_file,
                        "Encoding event prior to decode for conversion, action id %d\n",iVar8);
              }
              fflush((FILE *)cm->CMTrace_file);
              p_Var16 = cm;
              peVar14 = reassign_memory_event(cm,local_b0,0);
              return_event((event_path_data)p_Var16,peVar14);
              local_b0->ref_count = local_b0->ref_count + 1;
            }
            iVar10 = CMtrace_val[10];
            if (cm->CMTrace_file == (FILE *)0x0) {
              iVar10 = CMtrace_init(cm,EVerbose);
            }
            if (iVar10 != 0) {
              if (CMtrace_PID != 0) {
                local_60 = (FILE *)cm->CMTrace_file;
                _Var9 = getpid();
                pVar15 = pthread_self();
                fprintf(local_60,"P%lxT%lx - ",(long)_Var9,pVar15);
              }
              if (CMtrace_timing != 0) {
                clock_gettime(1,(timespec *)&local_58);
                fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_58.prev,local_58.thread_id);
              }
              fprintf((FILE *)cm->CMTrace_file,"Decoding event, action id %d\n",iVar8);
            }
            fflush((FILE *)cm->CMTrace_file);
            peVar14 = decode_action(cm,local_b0,local_a0);
            if (peVar14 == (event_item *)0x0) {
              return local_a8;
            }
            pqVar17->item = peVar14;
            iVar8 = determine_action(cm,stone,c,peVar14,(int)in_R8);
            local_a0 = stone->response_cache + iVar8;
          }
          pFVar19 = (FILE *)cm->CMTrace_file;
          if (pFVar19 == (FILE *)0x0) {
            iVar10 = CMtrace_init(cm,EVerbose);
            if (iVar10 != 0) {
              pFVar19 = (FILE *)cm->CMTrace_file;
              goto LAB_00133fe4;
            }
          }
          else if (CMtrace_val[10] != 0) {
LAB_00133fe4:
            fprintf(pFVar19,"next action event %p on ",local_b0);
            fprint_stone_identifier(cm->CMTrace_file,evp_00,s);
            pFVar19 = (FILE *)cm->CMTrace_file;
            pcVar23 = action_str[local_a0->action_type];
            p_Var3 = local_a0->reference_format;
            in_R8 = "<none>";
            if (p_Var3 != (FMFormat)0x0) {
              in_R8 = (char *)global_name_of_FMFormat(p_Var3,local_a0,pcVar23);
            }
            fprintf(pFVar19,
                    " action type is %s, reference_format is %p (%s), stage is %d, requires_decoded is %d\n"
                    ,pcVar23,p_Var3,in_R8,(ulong)local_a0->stage,local_a0->requires_decoded);
            fdump_action(cm->CMTrace_file,stone,local_a0,local_a0->proto_action_id,in_R8);
          }
          prVar13 = stone->response_cache;
          backpressure_check(cm,s);
          if (((prVar13[iVar8].stage == c) ||
              (c == Immediate_and_Multi && prVar13[iVar8].stage == Immediate)) &&
             (aVar2 = prVar13[iVar8].action_type, aVar2 < Action_Source)) {
            if ((0x63cU >> (aVar2 & 0x1f) & 1) == 0) {
              if ((0x840U >> (aVar2 & 0x1f) & 1) != 0) {
                if ((stone->new_enqueue_flag != 0) && (pqVar17->handled == 0)) {
                  stone->is_processing = 1;
                  pqVar17->handled = 1;
                  iVar8 = (*prVar13[iVar8].o.imm.handler)
                                    (cm,(_event_item *)stone->queue,pqVar17,
                                     (attr_list)prVar13[iVar8].o.decode.target_reference_format,
                                     stone->output_count,stone->output_stone_ids);
                  local_a8 = (local_a8 + 1) - (uint)(iVar8 == 0);
                  stone = stone_struct(cm->evp,s);
                  stone->is_processing = 0;
                  goto LAB_00134a22;
                }
                break;
              }
            }
            else {
              p_Var16 = (CManager_conflict)dequeue_item(cm,stone,pqVar17);
              piVar1 = local_38;
              switch(prVar13[iVar8].action_type) {
              case Action_Thread_Bridge:
                p_Var5 = stone->proto_actions;
                iVar8 = prVar13[iVar8].proto_action_id;
                pqVar18 = pqVar17;
                if (p_Var5[iVar8].o.term.target_stone_id == 0) {
                  thread_bridge_transfer
                            (cm,(event_item *)p_Var16,p_Var5[iVar8].o.thr_bri.target_cm,
                             p_Var5[iVar8].o.thr_bri.target_stone_id);
                  pqVar18 = pqVar22;
                }
                break;
              case Action_Terminal:
              case Action_Filter:
                iVar10 = prVar13[iVar8].proto_action_id;
                p_Var5 = stone->proto_actions;
                local_60 = (FILE *)p_Var5[iVar10].o.term.handler;
                p_Var4 = (attr_list)p_Var5[iVar10].o.term.client_data;
                iVar11 = CMtrace_val[10];
                if (cm->CMTrace_file == (FILE *)0x0) {
                  iVar11 = CMtrace_init(cm,EVerbose);
                }
                if (iVar11 != 0) {
                  if (CMtrace_PID != 0) {
                    pFVar19 = (FILE *)cm->CMTrace_file;
                    _Var9 = getpid();
                    pVar15 = pthread_self();
                    fprintf(pFVar19,"P%lxT%lx - ",(long)_Var9,pVar15);
                  }
                  if (CMtrace_timing != 0) {
                    clock_gettime(1,&local_70);
                    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_70.tv_sec,
                            local_70.tv_nsec);
                  }
                  fwrite("Executing terminal/filter event\n",0x20,1,(FILE *)cm->CMTrace_file);
                }
                act = (event_item *)(p_Var5 + iVar10);
                fflush((FILE *)cm->CMTrace_file);
                peVar14 = act;
                update_event_length_sum(cm,(proto_action *)act,(event_item *)p_Var16);
                pqVar17 = (queue_item *)INT_CMmalloc(0x18);
                pqVar17->item = (event_item *)p_Var16;
                p_Var25 = cm->evp;
                pqVar17->next = p_Var25->current_event_list;
                p_Var25->current_event_list = pqVar17;
                stone->is_processing = 1;
                if ((*(encode_state *)&act->attrs == Requires_Contig_Encoded) &&
                   (*(int *)((long)&p_Var16->transports + 4) == 0)) {
                  encode_event(p_Var16,peVar14);
                  p_Var25 = cm->evp;
                }
                local_58.stone_id = stone->local_id;
                pVar15 = pthread_self();
                local_58.next = p_Var25->activation_stack;
                if (local_58.next != (ev_handler_activation_ptr)0x0) {
                  (local_58.next)->prev = &local_58;
                }
                local_58.prev = (_ev_handler_activation_rec *)0x0;
                p_Var25->activation_stack = &local_58;
                local_58.thread_id = pVar15;
                IntCManager_unlock(cm,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                                   ,0x725);
                if (*(int *)((long)&p_Var16->transports + 4) == 0) {
                  iVar10 = (*(code *)local_60)(cm,p_Var16->control_list,p_Var4,
                                               *(undefined8 *)&p_Var16->reg_user_format_count);
                }
                else {
                  in_R8 = *(char **)&p_Var16->reg_user_format_count;
                  iVar10 = (*(((anon_union_48_6_c1ce387a_for_o *)&act->event_len)->term).handler)
                                     (cm,p_Var16->control_module_choice,
                                      *(void **)&p_Var16->CManager_ID,p_Var4);
                }
                IntCManager_lock(cm,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                                 ,0x72e);
                rec = (ev_handler_activation_ptr)(ulong)(uint)s;
                stone = stone_struct(cm->evp,s);
                pop_activation_record_from_stack((CManager_conflict)cm->evp,rec);
                stone->is_processing = 0;
                pqVar17 = cm->evp->current_event_list;
                if ((CManager_conflict)pqVar17->item == p_Var16) {
                  cm->evp->current_event_list = pqVar17->next;
                }
                else {
                  do {
                    pqVar22 = pqVar17;
                    pqVar17 = pqVar22->next;
                    if (pqVar17 == (queue_item *)0x0) {
                      puts("Failed to dequeue item from executing events list!");
                      goto LAB_00134537;
                    }
                  } while ((CManager_conflict)pqVar17->item != p_Var16);
                  pqVar22->next = pqVar17->next;
                }
                free(pqVar17);
LAB_00134537:
                if (prVar13[iVar8].action_type == Action_Filter) {
                  if (iVar10 == 0) {
                    iVar8 = CMtrace_val[10];
                    if (cm->CMTrace_file == (FILE *)0x0) {
                      iVar8 = CMtrace_init(cm,EVerbose);
                    }
                    if (iVar8 != 0) {
                      if (CMtrace_PID != 0) {
                        pFVar19 = (FILE *)cm->CMTrace_file;
                        _Var9 = getpid();
                        fprintf(pFVar19,"P%lxT%lx - ",(long)_Var9,pVar15);
                      }
                      if (CMtrace_timing != 0) {
                        clock_gettime(1,&local_70);
                        fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_70.tv_sec,
                                local_70.tv_nsec);
                      }
                      pFVar19 = (FILE *)cm->CMTrace_file;
                      __size = 0x17;
                      pcVar23 = "Filter discarded event\n";
                      goto LAB_001349e3;
                    }
                    goto LAB_001349e8;
                  }
                  iVar8 = CMtrace_val[10];
                  if (cm->CMTrace_file == (FILE *)0x0) {
                    iVar8 = CMtrace_init(cm,EVerbose);
                  }
                  if (iVar8 != 0) {
                    if (CMtrace_PID != 0) {
                      pFVar19 = (FILE *)cm->CMTrace_file;
                      _Var9 = getpid();
                      fprintf(pFVar19,"P%lxT%lx - ",(long)_Var9,pVar15);
                    }
                    if (CMtrace_timing != 0) {
                      clock_gettime(1,&local_70);
                      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_70.tv_sec,
                              local_70.tv_nsec);
                    }
                    fprintf((FILE *)cm->CMTrace_file,"Filter passed event to stone %x, submitting\n"
                            ,(ulong)*(uint *)&act->encoded_eventv);
                  }
                  fflush((FILE *)cm->CMTrace_file);
                  p_Var21 = cm;
                  internal_path_submit(cm,*(int *)&act->encoded_eventv,(event_item *)p_Var16);
                  local_a8 = local_a8 + 1;
                }
                else {
                  iVar8 = CMtrace_val[10];
                  if (cm->CMTrace_file == (FILE *)0x0) {
                    iVar8 = CMtrace_init(cm,EVerbose);
                  }
                  if (iVar8 != 0) {
                    if (CMtrace_PID != 0) {
                      pFVar19 = (FILE *)cm->CMTrace_file;
                      _Var9 = getpid();
                      fprintf(pFVar19,"P%lxT%lx - ",(long)_Var9,pVar15);
                    }
                    if (CMtrace_timing != 0) {
                      clock_gettime(1,&local_70);
                      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_70.tv_sec,
                              local_70.tv_nsec);
                    }
                    pFVar19 = (FILE *)cm->CMTrace_file;
                    __size = 0x16;
                    pcVar23 = "Finish terminal event\n";
LAB_001349e3:
                    fwrite(pcVar23,__size,1,pFVar19);
                  }
LAB_001349e8:
                  p_Var21 = (CManager_conflict)cm->CMTrace_file;
                  fflush((FILE *)p_Var21);
                }
                return_event((event_path_data)p_Var21,(event_item *)p_Var16);
                bVar7 = true;
                break;
              case Action_Immediate:
                iVar10 = local_38[1];
                p_Var6 = prVar13[iVar8].o.imm.handler;
                p_Var3 = prVar13[iVar8].o.decode.target_reference_format;
                in_R8 = (char *)(ulong)(uint)stone->output_count;
                stone->is_processing = 1;
                (*p_Var6)(cm,(_event_item *)p_Var16,p_Var3,
                          *(attr_list *)&p_Var16->reg_user_format_count,stone->output_count,
                          stone->output_stone_ids);
                evp_01 = cm->evp;
                stone = stone_struct(evp_01,s);
                stone->is_processing = 0;
                return_event(evp_01,(event_item *)p_Var16);
                local_a8 = local_a8 + (uint)(iVar10 < piVar1[1]);
                bVar7 = true;
                break;
              default:
                __assert_fail("FALSE",
                              "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                              ,0x796,"int process_events_stone(CManager, int, action_class)");
              case Action_Split:
                p_Var21 = cm;
                update_event_length_sum
                          (cm,stone->proto_actions + prVar13[iVar8].proto_action_id,
                           (event_item *)p_Var16);
                iVar8 = stone->output_count;
                if (0 < iVar8) {
                  lVar24 = 0;
                  do {
                    if (stone->output_stone_ids[lVar24] != -1) {
                      p_Var21 = cm;
                      internal_path_submit(cm,stone->output_stone_ids[lVar24],(event_item *)p_Var16)
                      ;
                      local_a8 = local_a8 + 1;
                      iVar8 = stone->output_count;
                    }
                    lVar24 = lVar24 + 1;
                  } while (lVar24 < iVar8);
                }
                return_event((event_path_data)p_Var21,(event_item *)p_Var16);
                break;
              case Action_Store:
                p_Var5 = stone->proto_actions;
                iVar8 = prVar13[iVar8].proto_action_id;
                puVar20 = (undefined1 *)((long)&p_Var5[iVar8].o + 0x18);
                (**(code **)(p_Var5[iVar8].o.bri.remote_contact + 0x10))(cm,puVar20,p_Var16);
                iVar10 = CMtrace_val[10];
                if (cm->CMTrace_file == (FILE *)0x0) {
                  iVar10 = CMtrace_init(cm,EVerbose);
                }
                if (iVar10 != 0) {
                  if (CMtrace_PID != 0) {
                    pFVar19 = (FILE *)cm->CMTrace_file;
                    _Var9 = getpid();
                    pVar15 = pthread_self();
                    fprintf(pFVar19,"P%lxT%lx - ",(long)_Var9,pVar15);
                  }
                  if (CMtrace_timing != 0) {
                    clock_gettime(1,&local_70);
                    fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_70.tv_sec,
                            local_70.tv_nsec);
                  }
                  fwrite("Enqueued item to store\n",0x17,1,(FILE *)cm->CMTrace_file);
                }
                fflush((FILE *)cm->CMTrace_file);
                iVar10 = p_Var5[iVar8].o.store.max_stored;
                iVar11 = p_Var5[iVar8].o.term.target_stone_id;
                p_Var5[iVar8].o.term.target_stone_id = iVar11 + 1;
                if (iVar10 != -1 && iVar10 <= iVar11) {
                  iVar10 = CMtrace_val[10];
                  if (cm->CMTrace_file == (FILE *)0x0) {
                    iVar10 = CMtrace_init(cm,EVerbose);
                  }
                  if (iVar10 != 0) {
                    if (CMtrace_PID != 0) {
                      pFVar19 = (FILE *)cm->CMTrace_file;
                      _Var9 = getpid();
                      pVar15 = pthread_self();
                      fprintf(pFVar19,"P%lxT%lx - ",(long)_Var9,pVar15);
                    }
                    if (CMtrace_timing != 0) {
                      clock_gettime(1,&local_70);
                      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",local_70.tv_sec,
                              local_70.tv_nsec);
                    }
                    fwrite("Dequeuing item because of limit\n",0x20,1,(FILE *)cm->CMTrace_file);
                  }
                  fflush((FILE *)cm->CMTrace_file);
                  peVar14 = (event_item *)
                            (**(code **)(p_Var5[iVar8].o.bri.remote_contact + 0x18))(cm,puVar20);
                  if (peVar14->ref_count < 1) {
                    __assert_fail("last_event->ref_count > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                                  ,0x785,"int process_events_stone(CManager, int, action_class)");
                  }
                  piVar1 = &p_Var5[iVar8].o.term.target_stone_id;
                  *piVar1 = *piVar1 + -1;
                  p_Var16 = cm;
                  internal_path_submit(cm,p_Var5[iVar8].o.thr_bri.target_stone_id,peVar14);
                  return_event((event_path_data)p_Var16,peVar14);
                  local_a8 = local_a8 + 1;
                }
              }
            }
          }
        }
        pqVar17 = pqVar18;
      } while (pqVar18 != (queue_item *)0x0);
      if (bVar7) {
LAB_00134a22:
        stone->new_enqueue_flag = 0;
      }
    }
  }
  else {
    stone->is_processing = 1;
    do_bridge_action(cm,s);
    stone->is_processing = 0;
    local_a8 = 0;
  }
  return local_a8;
}

Assistant:

static int
process_events_stone(CManager cm, int s, action_class c)
{

/*  Process all possible events on this stone that match the class */

    event_path_data evp = cm->evp;
    stone_type stone = NULL;
    int more_pending = 0;
    int did_something = 0;
    queue_item *item;
    action_state as = evp->as;


    if (s == -1) return 0;
    if (as->last_active_stone == s) as->last_active_stone = -1;
    stone = stone_struct(cm->evp, s);
    if (!stone) return 0;
    if (stone->queue_size == 0) return 0;
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Considering events on ");
	fprint_stone_identifier(cm->CMTrace_file, evp, s);
	fprintf(cm->CMTrace_file, "\n");
    }
    if (stone->local_id == -1) return 0;
    if (stone->is_draining == 2) return 0;
    if (stone->is_frozen == 1) return 0;
    if (c == Immediate_and_Multi && stone->pending_output) {
        more_pending += process_stone_pending_output(cm, s);
    }
    if (is_bridge_stone(cm, s) && (c != Bridge) && (c != Congestion)) return 0;
    
    if (CMtrace_on(cm, EVerbose)) {
	fprintf(cm->CMTrace_file, "Process events ");
	fprint_stone_identifier(cm->CMTrace_file, evp, s);
	fprintf(cm->CMTrace_file, "\n");
    }
    item = stone->queue->queue_head;
    if (is_bridge_stone(cm, s) && (c == Bridge)) {
	stone->is_processing = 1;
	do_bridge_action(cm, s);
	stone->is_processing = 0;
	return 0;
    }
    while (item != NULL && stone->is_draining == 0 && stone->is_frozen == 0) {
	queue_item *next = item->next;
	response_cache_element *resp;
	response_cache_element *act = NULL;
	if (item->handled) {
	    item = next;
	    continue;
	} else {
	    /* determine what kind of action to take here */
	    int resp_id;
	    event_item *event = item->item;
	    resp_id = determine_action(cm, stone, c, item->item, 0);
            assert(resp_id < stone->response_cache_count);
	    if (stone->response_cache[resp_id].action_type == Action_NoAction
                && c == Immediate_and_Multi) {
                /* ignore event */
                char *tmp = NULL;
                if (event->reference_format)
                    tmp = global_name_of_FMFormat(event->reference_format);
                printf("No action found for event %p submitted to \n", event);
		print_stone_identifier(evp, s);
		printf("\n");
                dump_stone(stone_struct(evp, s));
                if (tmp != NULL) {
                    static int first = 1;
                    printf("    Unhandled incoming event format was \"%s\"\n", tmp);
                    if (first) {
                        first = 0;
                        printf("\n\t** use \"format_info <format_name>\" to get full format information ** \n\n");
                    }
                } else {
                    printf("    Unhandled incoming event format was NULL\n");
                }
                if (tmp) free(tmp);
                event = dequeue_item(cm, stone, item);
                return_event(evp, event);
            }
	    resp = &stone->response_cache[resp_id];
	    if (resp->action_type == Action_Decode) {
		event_item *event_to_submit;
		if (!event->event_encoded) {
		    event_item *old_data_event;
		    CMtrace_out(cm, EVerbose, "Encoding event prior to decode for conversion, action id %d\n", resp_id);
		    old_data_event = reassign_memory_event(cm, event, 0);  /* reassign memory */
		    return_event(evp, old_data_event);
		    event->ref_count++;
		}
		CMtrace_out(cm, EVerbose, "Decoding event, action id %d\n", resp_id);
		event_to_submit = decode_action(cm, event, resp);
		if (event_to_submit == NULL) return more_pending;
		item->item = event_to_submit;
		resp_id = determine_action(cm, stone, c, event_to_submit, 0);
		resp = &stone->response_cache[resp_id];
	    }
	    if (CMtrace_on(cm, EVerbose)) {
		fprintf(cm->CMTrace_file, "next action event %p on ", event);
		fprint_stone_identifier(cm->CMTrace_file, evp, s);
		fprintf(cm->CMTrace_file, " action type is %s, reference_format is %p (%s), stage is %d, requires_decoded is %d\n",
			action_str[resp->action_type], resp->reference_format, 
			resp->reference_format ? global_name_of_FMFormat(resp->reference_format) : "<none>",
			resp->stage, resp->requires_decoded);
		fdump_action(cm->CMTrace_file, stone, resp, resp->proto_action_id, "    ");
	    }
            act = &stone->response_cache[resp_id];
	}
        backpressure_check(cm, s);
        if (!compatible_stages(c, act->stage)) {
	    /* do nothing */
        } else if (is_immediate_action(act)) {
	    event_item *event = dequeue_item(cm, stone, item);
	    ev_handler_activation_rec act_rec;
	    switch(act->action_type) {
	    case Action_Terminal:
	    case Action_Filter: {
		/* the data should already be in the right format */
		int proto = act->proto_action_id;
		proto_action *p = &stone->proto_actions[proto];
		int out;
		struct terminal_proto_vals *term = &(p->o.term);
		EVSimpleHandlerFunc handler = term->handler;
		void *client_data = term->client_data;
		CMtrace_out(cm, EVerbose, "Executing terminal/filter event\n");
		update_event_length_sum(cm, p, event);
		{
		    queue_item *new = malloc(sizeof(queue_item));
		    new->item = event;
		    new->next = cm->evp->current_event_list;
		    cm->evp->current_event_list = new;
		}
		did_something=1;
		stone->is_processing = 1;
		if ((p->data_state == Requires_Contig_Encoded) && 
		    (event->event_encoded == 0)) {
		    encode_event(cm, event);
		}
		act_rec.stone_id = stone->local_id;
		push_activation_record_on_stack(cm, &act_rec);
		CManager_unlock(cm);
		if (event->event_encoded == 0) {
		    out = (handler)(cm, event->decoded_event, client_data,
				    event->attrs);
		} else {
		    EVRawHandlerFunc han = (EVRawHandlerFunc)term->handler;
		    out = (han)(cm, event->encoded_event, event->event_len,
				    client_data, event->attrs);
		}
		CManager_lock(cm);
		stone = stone_struct(cm->evp, s);
		pop_activation_record_from_stack(cm, &act_rec);
		stone->is_processing = 0;
		{
		    if (cm->evp->current_event_list->item == event) {
			queue_item *tmp = cm->evp->current_event_list;
			cm->evp->current_event_list = tmp->next;
			free(tmp);
		    } else {
			queue_item *tmp = cm->evp->current_event_list;
			queue_item *last;
			while(tmp->item != event) {
			    last = tmp;
			    tmp = tmp->next;
			    if (tmp == NULL) break;
			}
			if (tmp == NULL) {
			    printf("Failed to dequeue item from executing events list!\n");
			} else {
			    last->next = tmp->next;
			    free(tmp);
			}
		    }
		}

		if (act->action_type == Action_Filter) {
		    if (out) {
			CMtrace_out(cm, EVerbose, "Filter passed event to stone %x, submitting\n", term->target_stone_id);
			internal_path_submit(cm, 
					     term->target_stone_id,
					     event);
			more_pending++;
		    } else {
			CMtrace_out(cm, EVerbose, "Filter discarded event\n");
		    }			    
		} else {
		    CMtrace_out(cm, EVerbose, "Finish terminal event\n");
		}
		return_event(evp, event);
		break;
	    }
	    case Action_Split: {
		int t = 0;
		proto_action *p = &stone->proto_actions[act->proto_action_id];
		update_event_length_sum(cm, p, event);
		for (t=0; t < stone->output_count; t++) {
		    if (stone->output_stone_ids[t] != -1) {
			internal_path_submit(cm, 
					     stone->output_stone_ids[t],
					     event);
			more_pending++;
		    }
		}
		return_event(evp, event);
		break;
	    }
	    case Action_Immediate: {
		EVImmediateHandlerFunc func;
		void *client_data;
		int *out_stones;
		int out_count;
		int in_play = as->events_in_play;
		/* data is already in the right format */
		func = act->o.imm.handler;
		client_data = act->o.imm.client_data;
		out_stones = stone->output_stone_ids;
		out_count = stone->output_count;
		did_something = 1;
		stone->is_processing = 1;
		func(cm, event, client_data, event->attrs, out_count, out_stones);
		stone = stone_struct(cm->evp, s);
		stone->is_processing = 0;
		return_event(evp, event);
		if (as->events_in_play > in_play)
		    more_pending++;   /* maybe??? */
		break;
	    }
            case Action_Store: {
		proto_action *p = &stone->proto_actions[act->proto_action_id];
                storage_queue_enqueue(cm, &p->o.store.queue, event);
                CMtrace_out(cm, EVerbose, "Enqueued item to store\n");
                if (++p->o.store.num_stored > p->o.store.max_stored
                        && p->o.store.max_stored != -1) {
                    CMtrace_out(cm, EVerbose, "Dequeuing item because of limit\n");
                    event_item *last_event;
                    last_event = storage_queue_dequeue(cm, &p->o.store.queue);
                    assert(last_event->ref_count > 0);
                    --p->o.store.num_stored;
                    internal_path_submit(cm, p->o.store.target_stone_id, last_event);
                    return_event(evp, last_event);
                    more_pending++;
                }
                break;
            }
	    case Action_Thread_Bridge: {
		proto_action *p = &stone->proto_actions[act->proto_action_id];
		if (p->o.thr_bri.target_cm_shutdown) continue;
                thread_bridge_transfer(cm, event, p->o.thr_bri.target_cm,
				       p->o.thr_bri.target_stone_id);
		break;
	    }
	    case Action_Bridge:
	    default:
		assert(FALSE);
	    }
	} else if (is_multi_action(act) || is_congestion_action(act)) {
	    /* event_item *event = dequeue_item(cm, stone->queue, item); XXX */
	    if (stone->new_enqueue_flag) {
		if (!item->handled) {
		    did_something = 1;
		    stone->is_processing = 1;
		    item->handled = 1;
		    if ((act->o.multi.handler)(cm, stone->queue, item,
					       act->o.multi.client_data, stone->output_count,
					       stone->output_stone_ids))
			more_pending++;
		    stone = stone_struct(cm->evp, s);
		    stone->is_processing = 0;
		}
	    }
            break;    
	} 
	item = next;
    }
    if (did_something) {
	stone->new_enqueue_flag = 0;
    }
    return more_pending;
}